

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

void stbiw__write_pixel(stbi__write_context *s,int rgb_dir,int comp,int write_alpha,int expand_mono,
                       uchar *d)

{
  uchar uVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined4 in_register_00000084;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  uchar px [3];
  uchar local_2b;
  uchar uStack_2a;
  uchar uStack_29;
  
  pauVar3 = (undefined1 (*) [16])CONCAT44(in_register_00000084,expand_mono);
  if (rgb_dir - 1U < 2) {
    uStack_29 = (*pauVar3)[0];
    local_2b = uStack_29;
    uStack_2a = uStack_29;
    if (write_alpha == 0) {
      if (0x3f < s->buf_used) {
        (*s->func)(s->context,s->buffer,s->buf_used);
        s->buf_used = 0;
      }
      iVar2 = s->buf_used;
      s->buf_used = iVar2 + 1;
      s->buffer[iVar2] = uStack_29;
      goto LAB_002956be;
    }
  }
  else {
    if (rgb_dir != 3) {
      if (rgb_dir != 4) goto LAB_002956be;
      if (comp == 0) {
        auVar5 = vpbroadcastd_avx512f();
        auVar4 = vmovdqu8_avx512vl(*pauVar3);
        auVar6 = vpmovzxbd_avx512f(ZEXT316(auVar4._0_3_));
        auVar6 = vpaddd_avx512f(auVar6,_DAT_0045c680);
        auVar5 = vpmulld_avx512f(auVar6,auVar5);
        auVar6 = vpbroadcastd_avx512f(ZEXT416(0x80808081));
        auVar7 = vpmuldq_avx512f(auVar5,auVar6);
        auVar8 = vpshufd_avx512f(auVar5,0xf5);
        auVar6 = vpmuldq_avx512f(auVar8,auVar6);
        auVar8 = vpmovsxbd_avx512f(_DAT_0045e690);
        auVar6 = vpermi2d_avx512f(auVar8,auVar7,auVar6);
        auVar5 = vpaddd_avx512f(auVar6,auVar5);
        auVar6 = vpsrld_avx512f(auVar5,0x1f);
        auVar5 = vpsrld_avx512f(auVar5,7);
        auVar5 = vpaddd_avx512f(auVar5,auVar6);
        auVar4 = vpmovdb_avx512f(auVar5);
        auVar4 = vpaddb_avx(auVar4,_DAT_0045e700);
        auVar4 = vmovdqu8_avx512vl(auVar4);
        local_2b = auVar4[0];
        uStack_2a = auVar4[1];
        uStack_29 = auVar4[2];
        goto LAB_002956b6;
      }
    }
    uStack_29 = (*pauVar3)[2];
    uStack_2a = (*pauVar3)[1];
    local_2b = (*pauVar3)[0];
  }
LAB_002956b6:
  stbiw__write3(s,uStack_29,uStack_2a,local_2b);
LAB_002956be:
  if (0 < comp) {
    uVar1 = pauVar3[-1][(long)rgb_dir + 0xf];
    if (0x3f < s->buf_used) {
      (*s->func)(s->context,s->buffer,s->buf_used);
      s->buf_used = 0;
    }
    iVar2 = s->buf_used;
    s->buf_used = iVar2 + 1;
    s->buffer[iVar2] = uVar1;
  }
  return;
}

Assistant:

static void stbiw__write_pixel(stbi__write_context *s, int rgb_dir, int comp, int write_alpha, int expand_mono, unsigned char *d)
{
   unsigned char bg[3] = { 255, 0, 255}, px[3];
   int k;

   if (write_alpha < 0)
      stbiw__write1(s, d[comp - 1]);

   switch (comp) {
      case 2: // 2 pixels = mono + alpha, alpha is written separately, so same as 1-channel case
      case 1:
         if (expand_mono)
            stbiw__write3(s, d[0], d[0], d[0]); // monochrome bmp
         else
            stbiw__write1(s, d[0]);  // monochrome TGA
         break;
      case 4:
         if (!write_alpha) {
            // composite against pink background
            for (k = 0; k < 3; ++k)
               px[k] = bg[k] + ((d[k] - bg[k]) * d[3]) / 255;
            stbiw__write3(s, px[1 - rgb_dir], px[1], px[1 + rgb_dir]);
            break;
         }
         /* FALLTHROUGH */
      case 3:
         stbiw__write3(s, d[1 - rgb_dir], d[1], d[1 + rgb_dir]);
         break;
   }
   if (write_alpha > 0)
      stbiw__write1(s, d[comp - 1]);
}